

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::rehash
          (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *this,size_t sizeHint)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  void *pvVar5;
  long in_RDI;
  long in_FS_OFFSET;
  R RVar6;
  Node<ProKey,_ProFunctionDef> *newNode;
  Node<ProKey,_ProFunctionDef> *n;
  size_t index;
  Span *span;
  size_t s;
  size_t oldNSpans;
  size_t oldBucketCount;
  Span *oldSpans;
  size_t newBucketCount;
  Bucket it;
  Node<ProKey,_ProFunctionDef> *in_stack_ffffffffffffff48;
  Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *in_stack_ffffffffffffff50;
  ProKey *in_stack_ffffffffffffff58;
  Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *in_stack_ffffffffffffff60;
  long lVar7;
  long local_98;
  Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *in_stack_ffffffffffffff70;
  long lVar8;
  size_t in_stack_ffffffffffffff90;
  ulong i;
  ulong local_60;
  Span *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar4 = GrowthPolicy::bucketsForCapacity((size_t)in_stack_ffffffffffffff48);
  lVar8 = *(long *)(in_RDI + 0x20);
  uVar2 = *(ulong *)(in_RDI + 0x10);
  RVar6 = allocateSpans(in_stack_ffffffffffffff90);
  local_50 = RVar6.spans;
  *(Span **)(in_RDI + 0x20) = local_50;
  *(size_t *)(in_RDI + 0x10) = sVar4;
  for (local_60 = 0; local_60 < uVar2 >> 7; local_60 = local_60 + 1) {
    for (i = 0; i < 0x80; i = i + 1) {
      bVar3 = Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::hasNode
                        ((Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)
                         (lVar8 + local_60 * 0x90),i);
      if (bVar3) {
        Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::at
                  (in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
        findBucket<ProKey>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        Bucket::insert((Bucket *)0x304187);
        Node<ProKey,_ProFunctionDef>::Node
                  ((Node<ProKey,_ProFunctionDef> *)in_stack_ffffffffffffff50,
                   in_stack_ffffffffffffff48);
      }
    }
    Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::freeData(in_stack_ffffffffffffff70);
  }
  if (lVar8 != 0) {
    pvVar5 = (void *)(lVar8 + -8);
    lVar7 = *(long *)(lVar8 + -8);
    local_98 = lVar8 + lVar7 * 0x90;
    if (lVar8 != local_98) {
      do {
        local_98 = local_98 + -0x90;
        Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::~Span
                  ((Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)0x304225);
      } while (local_98 != lVar8);
    }
    operator_delete__(pvVar5,lVar7 * 0x90 + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }